

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  int32 iVar4;
  int32 iVar5;
  uint32 uVar6;
  uint32 uVar7;
  LogMessage *other;
  int64 iVar8;
  int64 iVar9;
  uint64 uVar10;
  uint64 uVar11;
  Reflection *this_00;
  string first;
  string second;
  
  (*(a->super_MessageLite)._vptr_MessageLite[0x15])(a);
  CVar3 = FieldDescriptor::cpp_type(this->field_);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar4 = Reflection::GetInt32(this_00,a,this->field_);
    iVar5 = Reflection::GetInt32(this_00,b,this->field_);
    bVar2 = SBORROW4(iVar4,iVar5);
    bVar1 = iVar4 - iVar5 < 0;
    goto LAB_0037a788;
  case CPPTYPE_INT64:
    iVar8 = Reflection::GetInt64(this_00,a,this->field_);
    iVar9 = Reflection::GetInt64(this_00,b,this->field_);
    bVar2 = SBORROW8(iVar8,iVar9);
    bVar1 = iVar8 - iVar9 < 0;
LAB_0037a788:
    bVar1 = bVar2 != bVar1;
    break;
  case CPPTYPE_UINT32:
    uVar6 = Reflection::GetUInt32(this_00,a,this->field_);
    uVar7 = Reflection::GetUInt32(this_00,b,this->field_);
    bVar1 = uVar6 < uVar7;
    break;
  case CPPTYPE_UINT64:
    uVar10 = Reflection::GetUInt64(this_00,a,this->field_);
    uVar11 = Reflection::GetUInt64(this_00,b,this->field_);
    bVar1 = uVar10 < uVar11;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&first,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x80f);
    other = internal::LogMessage::operator<<((LogMessage *)&first,"Invalid key for map field.");
    internal::LogFinisher::operator=((LogFinisher *)&second,other);
    internal::LogMessage::~LogMessage((LogMessage *)&first);
    bVar1 = true;
    break;
  case CPPTYPE_BOOL:
    bVar2 = Reflection::GetBool(this_00,a,this->field_);
    bVar1 = Reflection::GetBool(this_00,b,this->field_);
    bVar1 = !bVar2 && bVar1;
    break;
  case CPPTYPE_STRING:
    Reflection::GetString_abi_cxx11_(&first,this_00,a,this->field_);
    Reflection::GetString_abi_cxx11_(&second,this_00,b,this->field_);
    bVar1 = std::operator<(&first,&second);
    std::__cxx11::string::~string((string *)&second);
    std::__cxx11::string::~string((string *)&first);
  }
  return bVar1;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32 first = reflection->GetInt32(*a, field_);
        int32 second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64 first = reflection->GetInt64(*a, field_);
        int64 second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32 first = reflection->GetUInt32(*a, field_);
        uint32 second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 first = reflection->GetUInt64(*a, field_);
        uint64 second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
        return true;
    }
  }